

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer_function_widget.cpp
# Opt level: O0

void __thiscall tfnw::TransferFunctionWidget::update_gpu_image(TransferFunctionWidget *this)

{
  _func_void_GLenum_GLint_GLint_GLsizei_GLsizei_GLint_GLenum_GLenum_void_ptr *p_Var1;
  size_type sVar2;
  uchar *puVar3;
  GLuint local_14;
  TransferFunctionWidget *pTStack_10;
  GLint prev_tex_2d;
  TransferFunctionWidget *this_local;
  
  local_14 = 0;
  pTStack_10 = this;
  (*_ptrc_glGetIntegerv)(0x8069,(GLint *)&local_14);
  if (this->colormap_img == 0xffffffff) {
    (*_ptrc_glGenTextures)(1,&this->colormap_img);
    (*_ptrc_glBindTexture)(0xde1,this->colormap_img);
    (*_ptrc_glTexParameteri)(0xde1,0x2801,0x2601);
    (*_ptrc_glTexParameteri)(0xde1,0x2800,0x2601);
    (*_ptrc_glTexParameteri)(0xde1,0x2802,0x812f);
    (*_ptrc_glTexParameteri)(0xde1,0x2803,0x812f);
  }
  if ((this->gpu_image_stale & 1U) != 0) {
    this->gpu_image_stale = false;
    (*_ptrc_glBindTexture)(0xde1,this->colormap_img);
    p_Var1 = _ptrc_glTexImage2D;
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      (&this->current_colormap);
    puVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       (&this->current_colormap);
    (*p_Var1)(0xde1,0,0x8051,(GLsizei)(sVar2 >> 2),1,0,0x1908,0x1401,puVar3);
  }
  (*_ptrc_glBindTexture)(0xde1,local_14);
  return;
}

Assistant:

void TransferFunctionWidget::update_gpu_image()
{
    GLint prev_tex_2d = 0;
    glGetIntegerv(GL_TEXTURE_BINDING_2D, &prev_tex_2d);

    if (colormap_img == (GLuint)-1) {
        glGenTextures(1, &colormap_img);
        glBindTexture(GL_TEXTURE_2D, colormap_img);
        glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
        glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
        glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
        glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
    }
    if (gpu_image_stale) {
        gpu_image_stale = false;
        glBindTexture(GL_TEXTURE_2D, colormap_img);
        glTexImage2D(GL_TEXTURE_2D,
                     0,
                     GL_RGB8,
                     (GLsizei)(current_colormap.size() / 4),
                     1,
                     0,
                     GL_RGBA,
                     GL_UNSIGNED_BYTE,
                     current_colormap.data());
    }
    glBindTexture(GL_TEXTURE_2D, prev_tex_2d);
}